

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int *piVar6;
  uint max_kk;
  int iVar7;
  Mat *A;
  ulong uVar8;
  float max_ii;
  Mat *pMVar9;
  ulong uVar10;
  long lVar11;
  uint _c;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int TILE_K;
  int TILE_N;
  int TILE_M;
  uint local_12c;
  uint local_d4;
  float local_d0 [2];
  undefined1 local_c8 [40];
  float local_a0;
  float local_9c;
  float local_98;
  undefined8 uStack_94;
  undefined1 auStack_8c [16];
  undefined1 local_78 [64];
  size_t local_38;
  
  get_optimal_tile_mnk
            (outch,0,inch,(int *)(local_d0 + 1),(int *)local_d0,(int *)&local_d4,opt->num_threads);
  _c = (outch + (int)local_d0[1] + -1) / (int)local_d0[1];
  local_38 = 0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_8_ = 0;
  local_78._24_4_ = 0;
  local_78._32_8_ = (Allocator *)0x0;
  local_78._40_4_ = 0;
  local_78._44_4_ = 0;
  local_78._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_78,local_d4 * (int)local_d0[1] * 0x24,1,opt->num_threads,4,
              (Allocator *)0x0);
  Mat::create(AT,local_d4 * (int)local_d0[1],0x24,(int)(inch + local_d4 + -1) / (int)local_d4,_c,4,
              (Allocator *)0x0);
  if (0 < (int)_c) {
    local_12c = 0;
    do {
      iVar7 = get_omp_thread_num();
      if (0 < inch) {
        A = (Mat *)((long)iVar7 * local_38 * local_78._16_8_ + local_78._0_8_);
        max_ii = (float)(outch - (int)local_d0[1] * local_12c);
        if ((int)local_d0[1] < (int)max_ii) {
          max_ii = local_d0[1];
        }
        iVar7 = 0;
        do {
          max_kk = inch - iVar7;
          if ((int)local_d4 < inch - iVar7) {
            max_kk = local_d4;
          }
          if (0 < (int)max_ii) {
            auVar19 = vpbroadcastq_avx512vl();
            auVar19 = vpaddq_avx2(auVar19,_DAT_005aa600);
            uVar8 = 0;
            pMVar9 = A;
            do {
              if (0 < (int)max_kk) {
                auVar20 = vpbroadcastq_avx512vl();
                auVar20 = vpsllq_avx2(auVar20,2);
                auVar20 = vpaddq_avx2(auVar19,auVar20);
                uVar10 = 0;
                do {
                  auVar21 = vpbroadcastq_avx512vl();
                  vpaddq_avx2(auVar20,auVar21);
                  auVar12 = vgatherqps_avx512vl(*(undefined8 *)
                                                 ((uVar10 + (long)iVar7) * 0x24 + (ulong)max_kk));
                  auVar13 = vgatherqps_avx512vl(*(undefined8 *)(uVar8 + 4));
                  auVar14 = vgatherqps_avx512vl(*(undefined8 *)(uVar8 + 8));
                  local_c8._0_8_ = auVar12._0_8_;
                  local_c8._8_4_ = auVar12._8_4_;
                  auVar18._8_4_ = 0xbf2aaaab;
                  auVar18._0_8_ = 0xbf2aaaabbf2aaaab;
                  auVar18._12_4_ = 0xbf2aaaab;
                  auVar15 = vmulps_avx512vl(auVar12,auVar18);
                  auVar16._8_4_ = 0x3ef15bef;
                  auVar16._0_8_ = 0x3ef15bef3ef15bef;
                  auVar16._12_4_ = 0x3ef15bef;
                  auVar16 = vmulps_avx512vl(auVar13,auVar16);
                  auVar17._8_4_ = 0x3eaaaaab;
                  auVar17._0_8_ = 0x3eaaaaab3eaaaaab;
                  auVar17._12_4_ = 0x3eaaaaab;
                  auVar17 = vmulps_avx512vl(auVar14,auVar17);
                  fVar1 = auVar17._0_4_;
                  auVar23._0_4_ = auVar16._0_4_ + fVar1;
                  fVar2 = auVar17._4_4_;
                  auVar23._4_4_ = auVar16._4_4_ + fVar2;
                  fVar3 = auVar17._8_4_;
                  auVar23._8_4_ = auVar16._8_4_ + fVar3;
                  auVar23._12_4_ = auVar16._12_4_ + auVar17._12_4_;
                  auVar18 = vsubps_avx(auVar15,auVar23);
                  local_c8._12_4_ = auVar18._0_4_;
                  local_c8._16_8_ = auVar18._4_8_;
                  auVar22._0_4_ = auVar16._0_4_ + auVar15._0_4_;
                  auVar22._4_4_ = auVar16._4_4_ + auVar15._4_4_;
                  auVar22._8_4_ = auVar16._8_4_ + auVar15._8_4_;
                  auVar22._12_4_ = auVar16._12_4_ + auVar15._12_4_;
                  auVar18 = vsubps_avx(auVar22,auVar17);
                  local_c8._24_4_ = auVar18._0_4_;
                  local_c8._28_4_ = auVar18._4_4_;
                  local_c8._32_4_ = auVar18._8_4_;
                  auVar15._8_4_ = 0x3e2aaaab;
                  auVar15._0_8_ = 0x3e2aaaab3e2aaaab;
                  auVar15._12_4_ = 0x3e2aaaab;
                  auVar18 = vmulps_avx512vl(auVar12,auVar15);
                  auVar12._8_4_ = 0x3e715bef;
                  auVar12._0_8_ = 0x3e715bef3e715bef;
                  auVar12._12_4_ = 0x3e715bef;
                  auVar16 = vmulps_avx512vl(auVar13,auVar12);
                  local_c8._36_4_ = auVar16._0_4_ + auVar18._0_4_ + fVar1;
                  local_a0 = auVar16._4_4_ + auVar18._4_4_ + fVar2;
                  local_9c = auVar16._8_4_ + auVar18._8_4_ + fVar3;
                  auVar18 = vsubps_avx(auVar18,auVar16);
                  local_98 = auVar18._0_4_ + fVar1;
                  uStack_94._4_4_ = (int)(auVar18._8_4_ + fVar3);
                  uStack_94._0_4_ = (int)(auVar18._4_4_ + fVar2);
                  auStack_8c._0_12_ = auVar14._0_12_;
                  lVar11 = 8;
                  do {
                    fVar1 = *(float *)((long)local_d0 + lVar11);
                    fVar2 = *(float *)((long)local_d0 + lVar11 + 4);
                    fVar3 = *(float *)(local_c8 + lVar11);
                    fVar4 = fVar2 * 0.47140452;
                    fVar5 = fVar3 * 0.33333334;
                    fVar2 = fVar2 * 0.23570226;
                    *(float *)&pMVar9->data = fVar1;
                    *(float *)((long)&pMVar9->data + 4) = fVar1 * -0.6666667 - (fVar4 + fVar5);
                    *(float *)&pMVar9->refcount = (fVar4 + fVar1 * -0.6666667) - fVar5;
                    *(float *)((long)&pMVar9->refcount + 4) = fVar2 + fVar1 * 0.16666667 + fVar5;
                    *(float *)&pMVar9->elemsize = (fVar1 * 0.16666667 - fVar2) + fVar5;
                    *(float *)((long)&pMVar9->elemsize + 4) = fVar3;
                    pMVar9 = (Mat *)&pMVar9->elempack;
                    lVar11 = lVar11 + 0xc;
                  } while (lVar11 != 0x50);
                  uVar10 = uVar10 + 1;
                } while (uVar10 != max_kk);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 != (uint)max_ii);
          }
          local_9c = (float)AT->w;
          local_c8._16_8_ = AT->elemsize;
          local_98 = (float)AT->h;
          local_c8._24_4_ = AT->elempack;
          local_c8._0_8_ =
               (long)AT->data +
               local_c8._16_8_ * (long)(int)local_98 * (long)(int)local_9c *
               (long)(iVar7 / (int)local_d4) + AT->cstep * (ulong)local_12c * local_c8._16_8_;
          local_c8._8_4_ = 0;
          local_c8._12_4_ = 0;
          local_c8._32_4_ = SUB84(AT->allocator,0);
          local_c8._36_4_ = (undefined4)((ulong)AT->allocator >> 0x20);
          local_a0 = 2.8026e-45;
          uStack_94._0_4_ = 1;
          uStack_94._4_4_ = 1;
          auStack_8c._4_8_ = (long)(int)local_98 * (long)(int)local_9c;
          pack_A_tile(A,(Mat *)local_c8,0x24,(int)max_ii,max_kk);
          iVar7 = iVar7 + local_d4;
        } while (iVar7 < inch);
      }
      local_12c = local_12c + 1;
    } while (local_12c != _c);
  }
  piVar6 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 36;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd43_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}